

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O2

int FmsMeshValidate(FmsMesh mesh)

{
  FmsInt *pFVar1;
  ulong uVar2;
  char **ppcVar3;
  FmsComponent pFVar4;
  FmsInt FVar5;
  FmsDomain pFVar6;
  int iVar7;
  ulong uVar8;
  FmsInt FVar9;
  FmsInt tag_id;
  FmsInt FVar10;
  FmsInt FVar11;
  ulong uVar12;
  bool bVar13;
  int local_64;
  
  if (mesh == (FmsMesh)0x0) {
    local_64 = 1;
  }
  else {
    pFVar1 = mesh->domain_offsets;
    if (*pFVar1 == 0) {
      FVar11 = mesh->num_domain_names;
      if (pFVar1[FVar11] == mesh->num_domains) {
        if (mesh->partition_id < mesh->num_partitions) {
          uVar2 = 0;
          FVar5 = 0;
          while (FVar10 = FVar5, uVar8 = uVar2, FVar10 != FVar11) {
            uVar12 = uVar8;
            while (uVar2 = pFVar1[FVar10 + 1], FVar5 = FVar10 + 1, uVar12 < pFVar1[FVar10 + 1]) {
              if (mesh->domains[uVar12]->name != mesh->domain_names[FVar10]) {
                return 5;
              }
              bVar13 = uVar12 != mesh->domains[uVar12]->id + uVar8;
              uVar12 = uVar12 + 1;
              if (bVar13) {
                return 6;
              }
            }
          }
          uVar2 = mesh->num_comps;
          ppcVar3 = mesh->domain_names;
          local_64 = 9;
          for (uVar8 = 0; uVar8 != uVar2; uVar8 = uVar8 + 1) {
            pFVar4 = mesh->comps[uVar8];
            if (pFVar4->id != uVar8) {
              return 7;
            }
            if (pFVar4->dim == 0x7f) {
              return 8;
            }
            FVar5 = pFVar4->num_parts;
            FVar10 = 0;
            while (FVar10 != FVar5) {
              pFVar6 = pFVar4->parts[FVar10].domain;
              FVar9 = 0;
              while( true ) {
                if (FVar11 == FVar9) goto LAB_00106184;
                iVar7 = strcmp(pFVar6->name,ppcVar3[FVar9]);
                if (iVar7 == 0) break;
                FVar9 = FVar9 + 1;
              }
              if (pFVar1[FVar9 + 1] - pFVar1[FVar9] <= pFVar6->id) {
                local_64 = 10;
                goto LAB_00106184;
              }
              FVar10 = FVar10 + 1;
              if (mesh->domains[pFVar1[FVar9] + pFVar6->id] != pFVar6) {
                local_64 = 0xb;
                goto LAB_00106184;
              }
            }
          }
LAB_00106184:
          if (uVar2 <= uVar8) {
            FVar11 = 0;
            do {
              if (mesh->num_tags == FVar11) {
                return 0;
              }
              pFVar4 = mesh->tags[FVar11]->comp;
              uVar8 = pFVar4->id;
              if (uVar2 <= uVar8) {
                return 0xc;
              }
              FVar11 = FVar11 + 1;
            } while (mesh->comps[uVar8] == pFVar4);
            local_64 = 0xd;
          }
        }
        else {
          local_64 = 4;
        }
      }
      else {
        local_64 = 3;
      }
    }
    else {
      local_64 = 2;
    }
  }
  return local_64;
}

Assistant:

int FmsMeshValidate(FmsMesh mesh) {
  if (!mesh) { E_RETURN(1); }
  // Perform some validation
  if (mesh->domain_offsets[0] != 0) { E_RETURN(2); }
  if (mesh->domain_offsets[mesh->num_domain_names] != mesh->num_domains) {
    E_RETURN(3);
  }
  if (mesh->partition_id >= mesh->num_partitions) { E_RETURN(4); }
  // Check domains for consistency
  for (FmsInt name_id = 0; name_id < mesh->num_domain_names; name_id++) {
    const FmsInt name_start = mesh->domain_offsets[name_id];
    const FmsInt name_end = mesh->domain_offsets[name_id+1];
    for (FmsInt domain_id = name_start; domain_id < name_end; domain_id++) {
      FmsDomain domain = mesh->domains[domain_id];
      if (domain->name != mesh->domain_names[name_id]) { E_RETURN(5); }
      if (name_start + domain->id != domain_id) { E_RETURN(6); }
      // TODO: Check that all side ids are in the expected ranges
    }
  }
  // Check that all components use domains from the same mesh
  char **domain_names = mesh->domain_names;
  for (FmsInt comp_id = 0; comp_id < mesh->num_comps; comp_id++) {
    FmsComponent comp = mesh->comps[comp_id];
    if (comp->id != comp_id) { E_RETURN(7); }
    if (comp->dim == FMS_INVALID_DIM) { E_RETURN(8); }
    for (FmsInt part_id = 0; part_id < comp->num_parts; part_id++) {
      FmsDomain domain = comp->parts[part_id].domain;
      FmsInt domain_name_id = 0;
      for ( ; 1; domain_name_id++) {
        if (domain_name_id == mesh->num_domain_names) { E_RETURN(9); }
        if (strcmp(domain->name, domain_names[domain_name_id]) == 0) { break; }
      }
      FmsInt b_offset = mesh->domain_offsets[domain_name_id];
      FmsInt num_domains = mesh->domain_offsets[domain_name_id+1] - b_offset;
      if (domain->id >= num_domains) { E_RETURN(10); }
      if (mesh->domains[b_offset + domain->id] != domain) { E_RETURN(11); }
    }
  }
  // Check that all tags use components from the same mesh
  for (FmsInt tag_id = 0; tag_id < mesh->num_tags; tag_id++) {
    FmsTag tag = mesh->tags[tag_id];
    FmsInt comp_id = tag->comp->id;
    if (comp_id >= mesh->num_comps) { E_RETURN(12); }
    if (mesh->comps[comp_id] != tag->comp) { E_RETURN(13); }
  }
  return 0;
}